

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QString * QFileDialog::getSaveFileName
                    (QWidget *parent,QString *caption,QString *dir,QString *filter,
                    QString *selectedFilter,Options options)

{
  ulong uVar1;
  QUrl *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  QWidget *in_R9;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  QStringList *in_stack_00000018;
  char16_t *str;
  QUrl selectedUrl;
  QStringList schemes;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff10;
  QString *selectedFilter_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_70;
  undefined4 local_6c;
  QUrl local_68;
  QUrl local_60;
  QArrayDataPointer<char16_t> local_58 [2];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_c;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_stack_00000008;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  selectedFilter_00 = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_58,(Data *)0x0,L"file",4);
  QString::QString((QString *)in_stack_ffffffffffffff10,
                   (DataPointer *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QList<QString>::QList<QString,void>
            ((QList<QString> *)in_stack_ffffffffffffff10,
             (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QString::~QString((QString *)0x75aa6a);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff10);
  local_60.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::fromLocalFile((QString *)&local_68);
  local_6c = local_c;
  getSaveFileUrl(in_R9,(QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_RDX,in_RSI,selectedFilter_00,
                 (QFlagsStorageHelper<QFileDialog::Option,_4>)SUB84((ulong)lVar2 >> 0x20,0),
                 in_stack_00000018);
  QUrl::~QUrl(&local_68);
  uVar1 = QUrl::isLocalFile();
  if ((uVar1 & 1) == 0) {
    uVar1 = QUrl::isEmpty();
    if ((uVar1 & 1) == 0) {
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                (&local_70,PrettyDecoded);
      QUrl::toString((QUrlTwoFlags_conflict *)in_RDI);
      goto LAB_0075ab79;
    }
  }
  QUrl::toLocalFile();
LAB_0075ab79:
  QUrl::~QUrl(&local_60);
  QList<QString>::~QList((QList<QString> *)0x75ab93);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return selectedFilter_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialog::getSaveFileName(QWidget *parent,
                                     const QString &caption,
                                     const QString &dir,
                                     const QString &filter,
                                     QString *selectedFilter,
                                     Options options)
{
    const QStringList schemes = QStringList(QStringLiteral("file"));
    const QUrl selectedUrl = getSaveFileUrl(parent, caption, QUrl::fromLocalFile(dir), filter,
                                            selectedFilter, options, schemes);
    if (selectedUrl.isLocalFile() || selectedUrl.isEmpty())
        return selectedUrl.toLocalFile();
    else
        return selectedUrl.toString();
}